

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O3

void __thiscall Room::Room(Room *this,string *rn,ItemTable *itable,bool sld)

{
  long *plVar1;
  long *plVar2;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this->_vptr_Room = (_func_int **)&PTR___cxa_pure_virtual_0010dda8;
  (this->rstate0)._M_dataplus._M_p = (pointer)&(this->rstate0).field_2;
  (this->rstate0)._M_string_length = 0;
  (this->rstate0).field_2._M_local_buf[0] = '\0';
  (this->rstate1)._M_dataplus._M_p = (pointer)&(this->rstate1).field_2;
  (this->rstate1)._M_string_length = 0;
  (this->rstate1).field_2._M_local_buf[0] = '\0';
  (this->rstate2)._M_dataplus._M_p = (pointer)&(this->rstate2).field_2;
  (this->rstate2)._M_string_length = 0;
  (this->rstate2).field_2._M_local_buf[0] = '\0';
  (this->rsdesc1)._M_dataplus._M_p = (pointer)&(this->rsdesc1).field_2;
  (this->rsdesc1)._M_string_length = 0;
  (this->rsdesc1).field_2._M_local_buf[0] = '\0';
  (this->rsdesc2)._M_dataplus._M_p = (pointer)&(this->rsdesc2).field_2;
  (this->rsdesc2)._M_string_length = 0;
  (this->rsdesc2).field_2._M_local_buf[0] = '\0';
  (this->rsdesc3)._M_dataplus._M_p = (pointer)&(this->rsdesc3).field_2;
  (this->rsdesc3)._M_string_length = 0;
  (this->rsdesc3).field_2._M_local_buf[0] = '\0';
  (this->rsdesc4)._M_dataplus._M_p = (pointer)&(this->rsdesc4).field_2;
  (this->rsdesc4)._M_string_length = 0;
  (this->rsdesc4).field_2._M_local_buf[0] = '\0';
  (this->roomName)._M_dataplus._M_p = (pointer)&(this->roomName).field_2;
  (this->roomName)._M_string_length = 0;
  (this->roomName).field_2._M_local_buf[0] = '\0';
  (this->displayName)._M_dataplus._M_p = (pointer)&(this->displayName).field_2;
  (this->displayName)._M_string_length = 0;
  (this->displayName).field_2._M_local_buf[0] = '\0';
  this->table = itable;
  std::__cxx11::string::_M_assign((string *)&this->displayName);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/RoomDescriptions/"
             ,"");
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)(rn->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_40 = *plVar2;
    lStack_38 = plVar1[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar2;
    local_50 = (long *)*plVar1;
  }
  local_48 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->roomName,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  this->showLongDescription = sld;
  parseData(this);
  return;
}

Assistant:

Room::Room(std::string rn, ItemTable * itable, bool sld) {

    table = itable;
    displayName = rn;
    roomName = std::string(RESOURCES_PATH) + rn;
    showLongDescription = sld;
    parseData();
}